

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_transaction_FundRawTransaction_PegoutTx1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_PegoutTx1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  int64_t tx_fee;
  char *output_tx_hex;
  int ret;
  int64_t calc_fee;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  undefined1 local_48 [16];
  void *handle;
  void *fund_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  uint32_t append_count;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  fund_handle = (void *)((ulong)fund_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&fund_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&fund_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x86b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_fee,(Message *)&fund_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee);
    if (fund_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (fund_handle != (void *)0x0)) {
        (**(code **)(*fund_handle + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fund_handle = (void *)CONCAT71(fund_handle._1_7_,handle != (void *)0x0);
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_fee);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&fund_handle,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x86c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_48) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fund_handle = (void *)0x0;
  ret = CfdInitializeFundRawTx
                  (handle,10,1,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
                   &fund_handle);
  tx_fee = (ulong)tx_fee._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x871,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    ret = CfdAddUtxoTemplateForFundRawTx
                    (handle,fund_handle,
                     "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",0,60000,
                     "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",(char *)0x0)
    ;
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x87b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdAddUtxoTemplateForFundRawTx
                    (handle,fund_handle,
                     "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",1,60000,
                     "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",(char *)0x0)
    ;
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x884,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdAddTargetAmountForFundRawTx
                    (handle,fund_handle,0,0,
                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
                     "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8"
                    );
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x889,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,1,0,0.0,true);
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x88d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,4,0,0.0,false);
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x890,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,6,0x24,0.0,false);
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x893,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,2,0,1.0,false);
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x896,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,3,0,0.15,false);
    tx_fee = tx_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tx_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x899,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tx_fee != 0)) {
          (**(code **)(*(long *)tx_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    output_tx_hex = (char *)0x0;
    append_count = 0;
    ret = CfdFinalizeFundRawTx
                    (handle,fund_handle,
                     "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000"
                     ,0.15,&tx_fee,&append_count,&output_tx_hex);
    calc_fee = (ulong)calc_fee._4_4_ << 0x20;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&calc_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&calc_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8a1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&calc_fee);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (calc_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (calc_fee != 0)) {
          (**(code **)(*(long *)calc_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      calc_fee = 0xbe;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"static_cast<int64_t>(190)","tx_fee",&calc_fee,&tx_fee);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&calc_fee);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a3,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&calc_fee);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (calc_fee != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (calc_fee != 0)) {
            (**(code **)(*(long *)calc_fee + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"kExpTxData","output_tx_hex",
                 "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000be000000000000"
                 ,output_tx_hex);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&calc_fee);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a4,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&calc_fee);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (calc_fee != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (calc_fee != 0)) {
            (**(code **)(*(long *)calc_fee + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(output_tx_hex);
      calc_fee = 0;
      ret = CfdGetCalculateFeeFundRawTx(handle,fund_handle,&calc_fee);
      local_60.data_ = (AssertHelperData *)((ulong)local_60.data_._4_4_ << 0x20);
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_60);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (local_60.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60.data_ = (AssertHelperData *)&DAT_000000bc;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"static_cast<int64_t>(188)","calc_fee",(long *)&local_60,
                 &calc_fee);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_60);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8aa,pcVar2);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (local_60.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    ret = CfdFreeFundRawTxHandle(handle,fund_handle);
    calc_fee = calc_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&calc_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&calc_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8ae,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&calc_fee);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (calc_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (calc_fee != 0)) {
          (**(code **)(*(long *)calc_fee + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    tx_fee = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&tx_fee);
    output_tx_hex = (char *)((ulong)output_tx_hex & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&output_tx_hex,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&output_tx_hex);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&calc_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8b5,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&calc_fee,(Message *)&output_tx_hex);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&calc_fee);
      if (output_tx_hex != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (output_tx_hex != (char *)0x0)) {
          (**(code **)(*(long *)output_tx_hex + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&output_tx_hex);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&calc_fee,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8b6,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&calc_fee,(Message *)&output_tx_hex);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&calc_fee);
      if (output_tx_hex != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (output_tx_hex != (char *)0x0)) {
          (**(code **)(*(long *)output_tx_hex + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)tx_fee);
  }
  ret = CfdFreeHandle(handle);
  tx_fee = tx_fee & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x8bc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output_tx_hex,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_PegoutTx1) {
  // 2 output data
  // fee: 190
  static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  // fee: 188
  //static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40400a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  // fee: 187 Failed to select coin. Not enough utxos
  // static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40500a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  static const char* const kExpTxData = "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000be000000000000";
  static const char* const kFeeAsset = "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fund_handle = nullptr;
  ret = CfdInitializeFundRawTx(
    handle, kCfdNetworkLiquidv1, 1, kFeeAsset, &fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    ret = CfdAddUtxoTemplateForFundRawTx(
        handle, fund_handle,
        "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 0,
        60000,
        "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
        kFeeAsset,
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddUtxoTemplateForFundRawTx(
        handle, fund_handle,
        "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 1,
        60000,
        "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
        kFeeAsset,
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0,
        0, kFeeAsset,
        "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxKnapsackMinChange, 0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxBlindMinimumBits, 36, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxDustFeeRate, 0, 1.0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxLongTermFeeRate, 0, 0.15, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee;
    char* output_tx_hex = nullptr;
    uint32_t append_count = 0;
    ret = CfdFinalizeFundRawTx(
        handle, fund_handle, kTxData, 0.15, &tx_fee, &append_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(static_cast<int64_t>(190), tx_fee);
      EXPECT_STREQ(kExpTxData, output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);

      int64_t calc_fee = 0;
      ret = CfdGetCalculateFeeFundRawTx(handle, fund_handle, &calc_fee);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(static_cast<int64_t>(188), calc_fee);
    }

    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}